

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Synth::renderFrame(V2Synth *this)

{
  float fVar1;
  float fVar2;
  uint32_t len;
  StereoSample *dest;
  bool bVar3;
  float local_3c;
  int local_38;
  float x;
  int ch;
  int i;
  float hcf;
  float lcf;
  StereoSample *mix;
  int local_18;
  int voice;
  int chan;
  int nsamples;
  V2Synth *this_local;
  
  len = (this->instance).SRcFrameSize;
  memset((this->instance).mixbuf,0,(long)(int)len << 3);
  memset((this->instance).aux1buf,0,(long)(int)len << 2);
  memset((this->instance).aux2buf,0,(long)(int)len << 2);
  memset((this->instance).auxabuf,0,(long)(int)len << 3);
  memset((this->instance).auxbbuf,0,(long)(int)len << 3);
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    mix._4_4_ = 0;
    while( true ) {
      bVar3 = false;
      if (mix._4_4_ < 0x40) {
        bVar3 = this->chanmap[mix._4_4_] != local_18;
      }
      if (!bVar3) break;
      mix._4_4_ = mix._4_4_ + 1;
    }
    if (mix._4_4_ != 0x40) {
      memset((this->instance).chanbuf,0,(long)(int)len << 3);
      for (; mix._4_4_ < 0x40; mix._4_4_ = mix._4_4_ + 1) {
        if (this->chanmap[mix._4_4_] == local_18) {
          V2Voice::render(this->voicesw + mix._4_4_,(this->instance).chanbuf,len);
        }
      }
      if (local_18 == 0xf) {
        ronanCBProcess((syWRonan *)&this->ronan,(this->instance).chanbuf[0].ch,len);
      }
      V2Chan::process(this->chansw + local_18,len);
    }
  }
  dest = (this->instance).mixbuf;
  V2Reverb::render(&this->reverb,dest,len);
  V2ModDel::renderAux2Main(&this->delay,dest,len);
  V2DCFilter::renderStereo(&this->dcf,dest,dest,len);
  fVar1 = this->lcfreq;
  fVar2 = this->hcfreq;
  for (x = 0.0; (int)x < (int)len; x = (float)((int)x + 1)) {
    for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
      local_3c = dest->ch[(long)(int)x * 2 + (long)local_38] - this->lcbuf[local_38];
      this->lcbuf[local_38] = fVar1 * local_3c + this->lcbuf[local_38];
      if ((fVar2 != 1.0) || (NAN(fVar2))) {
        this->hcbuf[local_38] = fVar2 * (local_3c - this->hcbuf[local_38]) + this->hcbuf[local_38];
        local_3c = this->hcbuf[local_38];
      }
      dest->ch[(long)(int)x * 2 + (long)local_38] = local_3c;
    }
  }
  V2Comp::render(&this->compr,dest,len);
  return;
}

Assistant:

void renderFrame()
    {
        int nsamples = instance.SRcFrameSize;

        // clear output buffer
        memset(instance.mixbuf, 0, nsamples * sizeof(StereoSample));

        // clear aux buffers
        memset(instance.aux1buf, 0, nsamples * sizeof(float));
        memset(instance.aux2buf, 0, nsamples * sizeof(float));
        memset(instance.auxabuf, 0, nsamples * sizeof(StereoSample));
        memset(instance.auxbbuf, 0, nsamples * sizeof(StereoSample));

        // process all channels
        for (int chan = 0; chan < CHANS; chan++)
        {
            // check if any voices are active on this channel
            int voice = 0;
            while (voice < POLY && chanmap[voice] != chan)
                voice++;

            if (voice == POLY)
                continue;

            // clear channel buffer
            memset(instance.chanbuf, 0, nsamples * sizeof(StereoSample));

            // render all voices on this channel
            for (; voice < POLY; voice++)
            {
                if (chanmap[voice] != chan)
                    continue;

                voicesw[voice].render(instance.chanbuf, nsamples);
            }

            // channel 15 -> Ronan
            if (chan == CHANS - 1)
                ronanCBProcess(&ronan, &instance.chanbuf[0].l, nsamples);

            chansw[chan].process(nsamples);
        }

        // global filters
        StereoSample *mix = instance.mixbuf;
        reverb.render(mix, nsamples);
        delay.renderAux2Main(mix, nsamples);
        dcf.renderStereo(mix, mix, nsamples);

        // low cut/high cut
        float lcf = lcfreq, hcf = hcfreq;
        for (int i = 0; i < nsamples; i++)
        {
            for (int ch = 0; ch < 2; ch++)
            {
                // low cut
                float x = mix[i].ch[ch] - lcbuf[ch];
                lcbuf[ch] += lcf * x;

                // high cut
                if (hcf != 1.0f)
                {
                    hcbuf[ch] += hcf * (x - hcbuf[ch]);
                    x = hcbuf[ch];
                }

                mix[i].ch[ch] = x;
            }
        }

        // sum compressor
        compr.render(mix, nsamples);

        DEBUG_PLOT_STEREO(mix, mix, nsamples);
    }